

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O2

Promise<kj::Own<capnp::ClientHook>_> __thiscall
kj::Promise<kj::Own<capnp::ClientHook>>::attach<kj::Own<capnp::ClientHook>>
          (Promise<kj::Own<capnp::ClientHook>> *this,Own<capnp::ClientHook> *attachments)

{
  AttachmentPromiseNode<kj::Own<capnp::ClientHook>_> *pAVar1;
  undefined8 *in_RDX;
  PromiseNode *extraout_RDX;
  Promise<kj::Own<capnp::ClientHook>_> PVar2;
  Own<kj::_::AttachmentPromiseNode<kj::Own<capnp::ClientHook>_>_> local_38;
  Own<capnp::ClientHook> local_28;
  Own<kj::_::PromiseNode> local_18;
  
  local_28.disposer = (Disposer *)*in_RDX;
  local_28.ptr = (ClientHook *)in_RDX[1];
  in_RDX[1] = 0;
  heap<kj::_::AttachmentPromiseNode<kj::Own<capnp::ClientHook>>,kj::Own<kj::_::PromiseNode>,kj::Own<capnp::ClientHook>>
            ((kj *)&local_38,(Own<kj::_::PromiseNode> *)attachments,&local_28);
  pAVar1 = local_38.ptr;
  local_18.disposer = local_38.disposer;
  local_38.ptr = (AttachmentPromiseNode<kj::Own<capnp::ClientHook>_> *)0x0;
  *(Disposer **)this = local_38.disposer;
  *(AttachmentPromiseNode<kj::Own<capnp::ClientHook>_> **)(this + 8) = pAVar1;
  local_18.ptr = (PromiseNode *)0x0;
  Own<kj::_::PromiseNode>::dispose(&local_18);
  Own<kj::_::AttachmentPromiseNode<kj::Own<capnp::ClientHook>_>_>::dispose(&local_38);
  Own<capnp::ClientHook>::dispose(&local_28);
  PVar2.super_PromiseBase.node.ptr = extraout_RDX;
  PVar2.super_PromiseBase.node.disposer = (Disposer *)this;
  return (Promise<kj::Own<capnp::ClientHook>_>)PVar2.super_PromiseBase.node;
}

Assistant:

Promise<T> Promise<T>::attach(Attachments&&... attachments) {
  return Promise(false, kj::heap<_::AttachmentPromiseNode<Tuple<Attachments...>>>(
      kj::mv(node), kj::tuple(kj::fwd<Attachments>(attachments)...)));
}